

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters_test.cpp
# Opt level: O0

void test_chars_encoding(char *value,vector<unsigned_char,_std::allocator<unsigned_char>_> *expected
                        )

{
  bool bVar1;
  pointer pvVar2;
  MessageBuilder *pMVar3;
  ResultBuilder *pRVar4;
  const_iterator __first1;
  const_iterator __last1;
  iterator __first2;
  ExpressionLhs<const_int_&> EVar5;
  ExpressionLhs<bool> EVar6;
  string_ref sVar7;
  ExpressionLhs<const_boost::basic_string_ref<char,_std::char_traits<char>_>_&> EVar8;
  ExpressionLhs<const_boost::basic_string_ref<char,_std::char_traits<char>_>_&> local_1558;
  SourceLineInfo local_1548;
  undefined1 local_1520 [8];
  ResultBuilder __catchResult_3;
  SourceLineInfo local_1270;
  undefined1 local_1248 [8];
  ResultBuilder __catchResult_2;
  allocator local_f79;
  string local_f78 [32];
  MessageBuilder local_f58;
  undefined1 local_d68 [8];
  ScopedMessage scopedMessage48;
  undefined1 local_ce8 [8];
  string_ref read_back;
  int32_t read_offset;
  ExpressionLhs<bool> local_cb0;
  SourceLineInfo local_ca0;
  undefined1 local_c78 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_int_&> local_9d0;
  SourceLineInfo local_9c0;
  undefined1 local_998 [8];
  ResultBuilder __catchResult;
  allocator local_6b9;
  string local_6b8 [32];
  MessageBuilder local_698;
  undefined1 local_4a8 [8];
  ScopedMessage scopedMessage42;
  chars local_41d;
  int32_t local_41c;
  undefined1 local_418 [4];
  int32_t write_offset;
  array<unsigned_char,_1024UL> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *expected_local;
  char *value_local;
  
  local_41c = 0;
  buffer._M_elems._1016_8_ = expected;
  expected_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)value;
  pvVar2 = std::array<unsigned_char,_1024UL>::data((array<unsigned_char,_1024UL> *)local_418);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
            ((basic_string_ref<char,_std::char_traits<char>_> *)&scopedMessage42.m_info.sequence,
             (char *)expected_local);
  cornelich::writers::chars::operator()(&local_41d,pvVar2,&local_41c,stack0xfffffffffffffbd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b8,"INFO",&local_6b9);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&__catchResult.m_shouldDebugBreak,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2a);
  Catch::MessageBuilder::MessageBuilder
            (&local_698,(string *)local_6b8,(SourceLineInfo *)&__catchResult.m_shouldDebugBreak,Info
            );
  pMVar3 = Catch::MessageBuilder::operator<<(&local_698,(char (*) [7])"value=");
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(char **)&expected_local);
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(char (*) [16])", write_offset=");
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,&local_41c);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_4a8,pMVar3);
  Catch::MessageBuilder::~MessageBuilder(&local_698);
  Catch::SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&__catchResult.m_shouldDebugBreak);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_9c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
               ,0x2b);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_998,"REQUIRE",&local_9c0,"write_offset == expected.size()",
               Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_9c0);
    EVar5 = Catch::ResultBuilder::operator->*((ResultBuilder *)local_998,&local_41c);
    local_9d0 = EVar5;
    __catchResult_1._664_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    buffer._M_elems._1016_8_);
    pRVar4 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&local_9d0,
                        (unsigned_long *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar4);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_998);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_998);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_998);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_ca0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
               ,0x2c);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_c78,"REQUIRE",&local_ca0,
               "std::equal(expected.begin(), expected.end(), buffer.begin())",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_ca0);
    __first1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          buffer._M_elems._1016_8_);
    __last1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         buffer._M_elems._1016_8_);
    __first2 = std::array<unsigned_char,_1024UL>::begin((array<unsigned_char,_1024UL> *)local_418);
    bVar1 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )__first1._M_current,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )__last1._M_current,__first2);
    EVar6 = Catch::ResultBuilder::operator->*((ResultBuilder *)local_c78,bVar1);
    local_cb0.m_rb = EVar6.m_rb;
    local_cb0.m_lhs = EVar6.m_lhs;
    Catch::ExpressionLhs<bool>::endExpression(&local_cb0);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_c78);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_c78);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_c78);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  read_back.len_._4_4_ = 0;
  pvVar2 = std::array<unsigned_char,_1024UL>::data((array<unsigned_char,_1024UL> *)local_418);
  sVar7 = cornelich::readers::chars::operator()
                    ((chars *)&scopedMessage48.m_info.field_0x77,pvVar2,
                     (int32_t *)((long)&read_back.len_ + 4));
  read_back.ptr_ = (char *)sVar7.len_;
  local_ce8 = (undefined1  [8])sVar7.ptr_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f78,"INFO",&local_f79);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&__catchResult_2.m_shouldDebugBreak,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x30);
  Catch::MessageBuilder::MessageBuilder
            (&local_f58,(string *)local_f78,(SourceLineInfo *)&__catchResult_2.m_shouldDebugBreak,
             Info);
  pMVar3 = Catch::MessageBuilder::operator<<(&local_f58,(char (*) [7])"value=");
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(char **)&expected_local);
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(char (*) [13])", read_back=");
  pMVar3 = Catch::MessageBuilder::operator<<
                     (pMVar3,(basic_string_ref<char,_std::char_traits<char>_> *)local_ce8);
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(char (*) [15])", read_offset=");
  pMVar3 = Catch::MessageBuilder::operator<<(pMVar3,(int *)((long)&read_back.len_ + 4));
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_d68,pMVar3);
  Catch::MessageBuilder::~MessageBuilder(&local_f58);
  Catch::SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&__catchResult_2.m_shouldDebugBreak);
  std::__cxx11::string::~string(local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1270,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
               ,0x31);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_1248,"REQUIRE",&local_1270,"write_offset == read_offset",
               Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_1270);
    EVar5 = Catch::ResultBuilder::operator->*((ResultBuilder *)local_1248,&local_41c);
    __catchResult_3._664_8_ = EVar5.m_rb;
    pRVar4 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&__catchResult_3.m_shouldDebugBreak,
                        (int *)((long)&read_back.len_ + 4));
    Catch::ResultBuilder::endExpression(pRVar4);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_1248);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_1248);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_1248);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1548,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
               ,0x32);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_1520,"REQUIRE",&local_1548,"read_back == value",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_1548);
    EVar8 = Catch::ResultBuilder::operator->*
                      ((ResultBuilder *)local_1520,
                       (basic_string_ref<char,_std::char_traits<char>_> *)local_ce8);
    local_1558 = EVar8;
    pRVar4 = Catch::ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&>::
             operator==((ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&> *
                        )&local_1558,(char **)&expected_local);
    Catch::ResultBuilder::endExpression(pRVar4);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_1520);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_1520);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_1520);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_d68);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_4a8);
  return;
}

Assistant:

void test_chars_encoding(const char * value, const std::vector<std::uint8_t> & expected)
{
    std::array<std::uint8_t, 1024> buffer;
    std::int32_t write_offset = 0;

    writers::chars()(buffer.data(), write_offset, value);
    INFO("value=" << value << ", write_offset=" << write_offset);
    REQUIRE(write_offset == expected.size());
    REQUIRE(std::equal(expected.begin(), expected.end(), buffer.begin()));

    std::int32_t read_offset = 0;
    auto read_back = readers::chars()(buffer.data(), read_offset);
    INFO("value=" << value << ", read_back=" << read_back << ", read_offset=" << read_offset);
    REQUIRE(write_offset == read_offset);
    REQUIRE(read_back == value);
}